

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O3

void __thiscall iqxmlrpc::ValueBuilder::do_visit_element(ValueBuilder *this,string *tagname)

{
  Parser *pPVar1;
  int iVar2;
  Value_type *pVVar3;
  Value_type *pVVar4;
  BuilderBase local_88;
  Value_type *local_70;
  StateMachine local_68;
  Value_type *local_50;
  undefined8 local_48;
  Value_type local_40 [2];
  undefined8 local_30;
  Value_type *local_28;
  
  iVar2 = StateMachine::change(&this->state_,tagname);
  if (iVar2 == 8) {
    pPVar1 = (this->super_ValueBuilderBase).super_BuilderBase.parser_;
    BuilderBase::BuilderBase(&local_88,pPVar1,false);
    local_70 = (Value_type *)0x0;
    local_88._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_0018ae18;
    StateMachine::StateMachine(&local_68,pPVar1,0);
    local_48 = 0;
    local_40[0]._vptr_Value_type._0_1_ = 0;
    local_30 = 0;
    local_50 = local_40;
    StateMachine::set_transitions
              (&local_68,
               (StateTransition *)
               (anonymous_namespace)::StructBuilder::StructBuilder(iqxmlrpc::Parser&)::trans);
    local_28 = (Value_type *)operator_new(0x38);
    local_28->_vptr_Value_type = (_func_int **)&PTR__Struct_0018b000;
    *(undefined4 *)&local_28[2]._vptr_Value_type = 0;
    local_28[3]._vptr_Value_type = (_func_int **)0x0;
    local_28[4]._vptr_Value_type = (_func_int **)(local_28 + 2);
    local_28[5]._vptr_Value_type = (_func_int **)(local_28 + 2);
    local_28[6]._vptr_Value_type = (_func_int **)0x0;
    pVVar4 = local_70;
    if ((local_70 != local_28) && (pVVar4 = local_28, local_70 != (Value_type *)0x0)) {
      (*local_70->_vptr_Value_type[1])();
    }
    local_70 = pVVar4;
    BuilderBase::build(&local_88,true);
    pVVar4 = local_70;
    local_70 = (Value_type *)0x0;
    local_88._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_0018ae18;
    if (local_50 != local_40) {
      operator_delete(local_50,CONCAT71(local_40[0]._vptr_Value_type._1_7_,
                                        local_40[0]._vptr_Value_type._0_1_) + 1);
      local_88._vptr_BuilderBase = (_func_int **)&PTR___cxa_pure_virtual_0018a508;
      if (local_70 != (Value_type *)0x0) {
        (*local_70->_vptr_Value_type[1])();
      }
    }
LAB_0016a43c:
    pVVar3 = (this->super_ValueBuilderBase).retval._M_ptr;
    if (pVVar3 != pVVar4) {
      if (pVVar3 != (Value_type *)0x0) {
        (*pVVar3->_vptr_Value_type[1])();
      }
      (this->super_ValueBuilderBase).retval._M_ptr = pVVar4;
    }
  }
  else {
    if (iVar2 == 9) {
      pPVar1 = (this->super_ValueBuilderBase).super_BuilderBase.parser_;
      BuilderBase::BuilderBase(&local_88,pPVar1,false);
      local_70 = (Value_type *)0x0;
      local_88._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_0018ae98;
      StateMachine::StateMachine(&local_68,pPVar1,0);
      local_50 = (Value_type *)0x0;
      StateMachine::set_transitions
                (&local_68,
                 (StateTransition *)
                 (anonymous_namespace)::ArrayBuilder::ArrayBuilder(iqxmlrpc::Parser&)::trans);
      local_50 = (Value_type *)operator_new(0x20);
      local_50->_vptr_Value_type = (_func_int **)&PTR__Array_0018afc8;
      local_50[1]._vptr_Value_type = (_func_int **)0x0;
      local_50[2]._vptr_Value_type = (_func_int **)0x0;
      local_50[3]._vptr_Value_type = (_func_int **)0x0;
      pVVar4 = local_70;
      if ((local_70 != local_50) && (pVVar4 = local_50, local_70 != (Value_type *)0x0)) {
        (*local_70->_vptr_Value_type[1])();
      }
      local_70 = pVVar4;
      BuilderBase::build(&local_88,true);
      pVVar4 = local_70;
      goto LAB_0016a43c;
    }
    if (iVar2 == 10) {
      pVVar3 = (Value_type *)operator_new(0x10);
      pVVar3->_vptr_Value_type = (_func_int **)0x0;
      pVVar3[1]._vptr_Value_type = (_func_int **)0x0;
      pVVar3->_vptr_Value_type = (_func_int **)&PTR__Value_type_0018b0d8;
      pVVar4 = (this->super_ValueBuilderBase).retval._M_ptr;
      if (pVVar4 != pVVar3) {
        if (pVVar4 != (Value_type *)0x0) {
          (*pVVar4->_vptr_Value_type[1])();
        }
        (this->super_ValueBuilderBase).retval._M_ptr = pVVar3;
      }
      goto LAB_0016a45f;
    }
    pVVar4 = (this->super_ValueBuilderBase).retval._M_ptr;
  }
  if (pVVar4 == (Value_type *)0x0) {
    return;
  }
LAB_0016a45f:
  (this->super_ValueBuilderBase).super_BuilderBase.want_exit_ = true;
  return;
}

Assistant:

void
ValueBuilder::do_visit_element(const std::string& tagname)
{
  switch (state_.change(tagname)) {
  case STRUCT:
    retval.reset(sub_build<Value_type*, StructBuilder>(true));
    break;

  case ARRAY:
    retval.reset(sub_build<Value_type*, ArrayBuilder>(true));
    break;

  case NIL:
    retval.reset(new Nil());
    break;

  default:
    // wait for text within <i4>...</i4>, etc...
    break;
  }

  if (retval.get())
    want_exit();
}